

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqcompiler.cpp
# Opt level: O3

void __thiscall SQCompiler::Statement(SQCompiler *this,bool closeframe)

{
  SQUnsignedInteger *pSVar1;
  long lVar2;
  SQTable *this_00;
  long n;
  ulong uVar3;
  uint uVar4;
  SQObjectValue SVar5;
  undefined1 uVar6;
  SQInteger SVar7;
  longlong *p;
  SQInteger SVar8;
  SQUnsignedInteger SVar9;
  ulong uVar10;
  byte bVar11;
  SQFuncState *pSVar12;
  SQUnsignedInteger SVar13;
  SQObject SVar14;
  SQObject SVar15;
  SQObjectPtr strongid;
  SQObjectPtr local_48;
  SQObjectPtr local_38;
  
  SQFuncState::AddLineInfos(this->_fs,(this->_lex)._currentline,this->_lineinfo,false);
  lVar2 = this->_token;
  if (0x132 < lVar2) {
    if (lVar2 == 0x133) {
      ClassStatement(this);
      goto LAB_00147001;
    }
    if (lVar2 == 0x143) {
      EnumStatement(this);
      goto LAB_00147001;
    }
    if (lVar2 == 0x144) {
      SVar7 = SQLexer::Lex(&this->_lex);
      this->_token = SVar7;
      SVar14 = Expect(this,0x102);
      Expect(this,0x3d);
      SVar15 = ExpectScalar(this);
      OptionalSemicolon(this);
      this_00 = (this->_vm->_sharedstate->_consts).super_SQObject._unVal.pTable;
      if ((SVar14._type >> 0x1b & 1) != 0) {
        pSVar1 = &((SVar14._unVal.pTable)->super_SQDelegable).super_SQCollectable.super_SQRefCounted
                  ._uiRef;
        *pSVar1 = *pSVar1 + 1;
      }
      if ((SVar15._type >> 0x1b & 1) != 0) {
        pSVar1 = &((SVar15._unVal.pTable)->super_SQDelegable).super_SQCollectable.super_SQRefCounted
                  ._uiRef;
        *pSVar1 = *pSVar1 + 1;
      }
      local_48.super_SQObject._unVal.nInteger = SVar14._unVal.nInteger;
      local_38.super_SQObject._type = SVar15._type;
      local_38.super_SQObject._unVal.nInteger = SVar15._unVal.nInteger;
      local_48.super_SQObject._type = SVar14._type;
      SQTable::NewSlot(this_00,&local_48,&local_38);
      SQObjectPtr::~SQObjectPtr(&local_38);
      SVar5 = local_48.super_SQObject._unVal;
      uVar4 = local_48.super_SQObject._type >> 0x1b;
      local_48.super_SQObject._type = 0x1000001;
      local_48.super_SQObject._unVal.pTable = (SQTable *)0x0;
      if ((uVar4 & 1) != 0) {
        pSVar1 = &((SVar5.pTable)->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
        *pSVar1 = *pSVar1 - 1;
        if (*pSVar1 == 0) {
          (*((SVar5.pTable)->super_SQDelegable).super_SQCollectable.super_SQRefCounted.
            _vptr_SQRefCounted[2])();
        }
      }
      SQObjectPtr::~SQObjectPtr(&local_48);
      goto LAB_00147001;
    }
switchD_00146a04_caseD_10d:
    CommaExpr(this);
    SQFuncState::DiscardTarget(this->_fs);
    goto LAB_00147001;
  }
  switch(lVar2) {
  case 0x10c:
    SwitchStatement(this);
    break;
  case 0x10d:
  case 0x10e:
  case 0x10f:
  case 0x111:
  case 0x116:
  case 0x118:
  case 0x119:
  case 0x11a:
  case 0x11c:
  case 0x11f:
  case 0x120:
  case 0x121:
  case 0x122:
  case 0x126:
    goto switchD_00146a04_caseD_10d;
  case 0x110:
    IfStatement(this);
    break;
  case 0x112:
    WhileStatement(this);
    break;
  case 0x113:
    pSVar12 = this->_fs;
    SVar9 = (pSVar12->_breaktargets)._size;
    if (SVar9 == 0) {
      Error(this,"\'break\' has to be in a loop block");
      pSVar12 = this->_fs;
      SVar9 = (pSVar12->_breaktargets)._size;
    }
    lVar2 = (pSVar12->_breaktargets)._vals[SVar9 - 1];
    if (0 < lVar2) {
      local_48.super_SQObject._5_1_ = (uchar)lVar2;
      local_48.super_SQObject._0_5_ = 0x3800000000;
      local_48.super_SQObject._0_8_ = (ulong)local_48.super_SQObject._4_2_ << 0x20;
      SQFuncState::AddInstruction(pSVar12,(SQInstruction *)&local_48);
      pSVar12 = this->_fs;
    }
    SVar7 = SQFuncState::GetStackSize(pSVar12);
    lVar2 = (this->_scope).stacksize;
    if ((SVar7 != lVar2) && (SVar7 = SQFuncState::CountOuters(this->_fs,lVar2), SVar7 != 0)) {
      local_48.super_SQObject._4_4_ = 0x3c;
      local_48.super_SQObject._type = (SQInt32)(this->_scope).stacksize;
      SQFuncState::AddInstruction(this->_fs,(SQInstruction *)&local_48);
    }
    local_48.super_SQObject._type = -0x4d2;
    local_48.super_SQObject._4_1_ = '\x1c';
    local_48.super_SQObject._5_1_ = '\0';
    local_48.super_SQObject._6_1_ = '\0';
    local_48.super_SQObject._7_1_ = '\0';
    SQFuncState::AddInstruction(this->_fs,(SQInstruction *)&local_48);
    pSVar12 = this->_fs;
    SVar9 = (pSVar12->_instructions)._size;
    uVar3 = (pSVar12->_unresolvedbreaks)._allocated;
    p = (pSVar12->_unresolvedbreaks)._vals;
    uVar10 = (pSVar12->_unresolvedbreaks)._size;
    if (uVar3 <= uVar10) {
      SVar13 = 4;
      if (uVar10 * 2 != 0) {
        SVar13 = uVar10 * 2;
      }
      p = (longlong *)sq_vm_realloc(p,uVar3 << 3,SVar13 * 8);
      (pSVar12->_unresolvedbreaks)._vals = p;
      (pSVar12->_unresolvedbreaks)._allocated = SVar13;
      uVar10 = (pSVar12->_unresolvedbreaks)._size;
    }
    (pSVar12->_unresolvedbreaks)._size = uVar10 + 1;
    goto LAB_00146f2b;
  case 0x114:
    ForStatement(this);
    break;
  case 0x115:
    DoWhileStatement(this);
    break;
  case 0x117:
    ForEachStatement(this);
    break;
  case 0x11b:
    LocalDeclStatement(this);
    break;
  case 0x11d:
    FunctionStatement(this);
    break;
  case 0x11e:
  case 0x124:
    bVar11 = 0x17;
    if (lVar2 != 0x11e) {
      this->_fs->_bgenerator = true;
      bVar11 = 0x31;
    }
    SVar7 = SQLexer::Lex(&this->_lex);
    this->_token = SVar7;
    if (((((this->_lex)._prevtoken == 10) || (SVar7 == 0)) || (SVar7 == 0x3b)) || (SVar7 == 0x7d)) {
      pSVar12 = this->_fs;
      if ((lVar2 == 0x11e) && (0 < pSVar12->_traps)) {
        local_48.super_SQObject._5_1_ = (uchar)pSVar12->_traps;
        local_48.super_SQObject._0_5_ = 0x3800000000;
        local_48.super_SQObject._0_8_ = (ulong)local_48.super_SQObject._4_2_ << 0x20;
        SQFuncState::AddInstruction(pSVar12,(SQInstruction *)&local_48);
        pSVar12 = this->_fs;
      }
      pSVar12->_returnexp = -1;
      SVar7 = SQFuncState::GetStackSize(pSVar12);
      uVar6 = (undefined1)SVar7;
      local_48.super_SQObject._0_5_ = (uint5)bVar11 << 0x20;
      local_48.super_SQObject._5_1_ = 0xff;
      local_48.super_SQObject._0_8_ = (ulong)local_48.super_SQObject._4_2_ << 0x20;
    }
    else {
      SVar9 = (this->_fs->_instructions)._size;
      CommaExpr(this);
      pSVar12 = this->_fs;
      if ((lVar2 == 0x11e) && (0 < pSVar12->_traps)) {
        local_48.super_SQObject._5_1_ = (uchar)pSVar12->_traps;
        local_48.super_SQObject._0_5_ = 0x3800000000;
        local_48.super_SQObject._0_8_ = (ulong)local_48.super_SQObject._4_2_ << 0x20;
        SQFuncState::AddInstruction(pSVar12,(SQInstruction *)&local_48);
        pSVar12 = this->_fs;
      }
      pSVar12->_returnexp = SVar9;
      SVar7 = SQFuncState::PopTarget(pSVar12);
      SVar8 = SQFuncState::GetStackSize(this->_fs);
      uVar6 = (undefined1)SVar8;
      local_48.super_SQObject._0_5_ = (uint5)bVar11 << 0x20;
      local_48.super_SQObject._5_1_ = '\x01';
      local_48.super_SQObject._4_2_ = local_48.super_SQObject._4_2_;
      local_48.super_SQObject._type = (int)SVar7;
      local_48.super_SQObject._6_2_ = 0;
    }
    local_48.super_SQObject._6_1_ = uVar6;
    local_48.super_SQObject._7_1_ = 0;
    goto LAB_00146fc1;
  case 0x123:
    pSVar12 = this->_fs;
    SVar9 = (pSVar12->_continuetargets)._size;
    if (SVar9 == 0) {
      Error(this,"\'continue\' has to be in a loop block");
      pSVar12 = this->_fs;
      SVar9 = (pSVar12->_continuetargets)._size;
    }
    lVar2 = (pSVar12->_continuetargets)._vals[SVar9 - 1];
    if (0 < lVar2) {
      local_48.super_SQObject._5_1_ = (uchar)lVar2;
      local_48.super_SQObject._0_5_ = 0x3800000000;
      local_48.super_SQObject._0_8_ = (ulong)local_48.super_SQObject._4_2_ << 0x20;
      SQFuncState::AddInstruction(pSVar12,(SQInstruction *)&local_48);
      pSVar12 = this->_fs;
    }
    SVar7 = SQFuncState::GetStackSize(pSVar12);
    lVar2 = (this->_scope).stacksize;
    if ((SVar7 != lVar2) && (SVar7 = SQFuncState::CountOuters(this->_fs,lVar2), SVar7 != 0)) {
      local_48.super_SQObject._4_4_ = 0x3c;
      local_48.super_SQObject._type = (SQInt32)(this->_scope).stacksize;
      SQFuncState::AddInstruction(this->_fs,(SQInstruction *)&local_48);
    }
    local_48.super_SQObject._type = -0x4d2;
    local_48.super_SQObject._4_1_ = '\x1c';
    local_48.super_SQObject._5_1_ = '\0';
    local_48.super_SQObject._6_1_ = '\0';
    local_48.super_SQObject._7_1_ = '\0';
    SQFuncState::AddInstruction(this->_fs,(SQInstruction *)&local_48);
    pSVar12 = this->_fs;
    SVar9 = (pSVar12->_instructions)._size;
    uVar3 = (pSVar12->_unresolvedcontinues)._allocated;
    p = (pSVar12->_unresolvedcontinues)._vals;
    uVar10 = (pSVar12->_unresolvedcontinues)._size;
    if (uVar3 <= uVar10) {
      SVar13 = 4;
      if (uVar10 * 2 != 0) {
        SVar13 = uVar10 * 2;
      }
      p = (longlong *)sq_vm_realloc(p,uVar3 << 3,SVar13 * 8);
      (pSVar12->_unresolvedcontinues)._vals = p;
      (pSVar12->_unresolvedcontinues)._allocated = SVar13;
      uVar10 = (pSVar12->_unresolvedcontinues)._size;
    }
    (pSVar12->_unresolvedcontinues)._size = uVar10 + 1;
LAB_00146f2b:
    p[uVar10] = SVar9 - 1;
LAB_00146f2f:
    SVar7 = SQLexer::Lex(&this->_lex);
    this->_token = SVar7;
    break;
  case 0x125:
    TryCatchStatement(this);
    break;
  case 0x127:
    SVar7 = SQLexer::Lex(&this->_lex);
    this->_token = SVar7;
    CommaExpr(this);
    pSVar12 = this->_fs;
    SVar7 = SQFuncState::PopTarget(pSVar12);
    local_48.super_SQObject._5_1_ = (uchar)SVar7;
    local_48.super_SQObject._0_5_ = 0x3900000000;
    local_48.super_SQObject._0_8_ = (ulong)local_48.super_SQObject._4_2_ << 0x20;
LAB_00146fc1:
    SQFuncState::AddInstruction(pSVar12,(SQInstruction *)&local_48);
    break;
  default:
    if (lVar2 != 0x3b) {
      if (lVar2 == 0x7b) {
        local_48.super_SQObject._0_8_ = (this->_scope).outers;
        local_48.super_SQObject._unVal = (SQObjectValue)(this->_scope).stacksize;
        pSVar12 = this->_fs;
        (this->_scope).outers = pSVar12->_outers;
        SVar7 = SQFuncState::GetStackSize(pSVar12);
        (this->_scope).stacksize = SVar7;
        SVar7 = SQLexer::Lex(&this->_lex);
        this->_token = SVar7;
        Statements(this);
        Expect(this,0x7d);
        pSVar12 = this->_fs;
        if (closeframe) {
          lVar2 = pSVar12->_outers;
          SVar7 = SQFuncState::GetStackSize(pSVar12);
          n = (this->_scope).stacksize;
          if (SVar7 != n) {
            SQFuncState::SetStackSize(this->_fs,n);
            if (lVar2 != this->_fs->_outers) {
              local_38.super_SQObject._type = (SQObjectType)(this->_scope).stacksize;
              local_38.super_SQObject._4_4_ = 0x3c;
              SQFuncState::AddInstruction(this->_fs,(SQInstruction *)&local_38);
            }
          }
        }
        else {
          SVar7 = SQFuncState::GetStackSize(pSVar12);
          lVar2 = (this->_scope).stacksize;
          if (SVar7 != lVar2) {
            SQFuncState::SetStackSize(this->_fs,lVar2);
          }
        }
        (this->_scope).outers = local_48.super_SQObject._0_8_;
        (this->_scope).stacksize = (SQInteger)local_48.super_SQObject._unVal;
        break;
      }
      goto switchD_00146a04_caseD_10d;
    }
    goto LAB_00146f2f;
  }
LAB_00147001:
  this->_fs->_optimization = false;
  return;
}

Assistant:

void Statement(bool closeframe = true)
    {
        _fs->AddLineInfos(_lex._currentline, _lineinfo);
        switch(_token){
        case _SC(';'):  Lex();                  break;
        case TK_IF:     IfStatement();          break;
        case TK_WHILE:      WhileStatement();       break;
        case TK_DO:     DoWhileStatement();     break;
        case TK_FOR:        ForStatement();         break;
        case TK_FOREACH:    ForEachStatement();     break;
        case TK_SWITCH: SwitchStatement();      break;
        case TK_LOCAL:      LocalDeclStatement();   break;
        case TK_RETURN:
        case TK_YIELD: {
            SQOpcode op;
            if(_token == TK_RETURN) {
                op = _OP_RETURN;
            }
            else {
                op = _OP_YIELD;
                _fs->_bgenerator = true;
            }
            Lex();
            if(!IsEndOfStatement()) {
                SQInteger retexp = _fs->GetCurrentPos()+1;
                CommaExpr();
                if(op == _OP_RETURN && _fs->_traps > 0)
                    _fs->AddInstruction(_OP_POPTRAP, _fs->_traps, 0);
                _fs->_returnexp = retexp;
                _fs->AddInstruction(op, 1, _fs->PopTarget(),_fs->GetStackSize());
            }
            else{
                if(op == _OP_RETURN && _fs->_traps > 0)
                    _fs->AddInstruction(_OP_POPTRAP, _fs->_traps ,0);
                _fs->_returnexp = -1;
                _fs->AddInstruction(op, 0xFF,0,_fs->GetStackSize());
            }
            break;}
        case TK_BREAK:
            if(_fs->_breaktargets.size() <= 0)Error(_SC("'break' has to be in a loop block"));
            if(_fs->_breaktargets.top() > 0){
                _fs->AddInstruction(_OP_POPTRAP, _fs->_breaktargets.top(), 0);
            }
            RESOLVE_OUTERS();
            _fs->AddInstruction(_OP_JMP, 0, -1234);
            _fs->_unresolvedbreaks.push_back(_fs->GetCurrentPos());
            Lex();
            break;
        case TK_CONTINUE:
            if(_fs->_continuetargets.size() <= 0)Error(_SC("'continue' has to be in a loop block"));
            if(_fs->_continuetargets.top() > 0) {
                _fs->AddInstruction(_OP_POPTRAP, _fs->_continuetargets.top(), 0);
            }
            RESOLVE_OUTERS();
            _fs->AddInstruction(_OP_JMP, 0, -1234);
            _fs->_unresolvedcontinues.push_back(_fs->GetCurrentPos());
            Lex();
            break;
        case TK_FUNCTION:
            FunctionStatement();
            break;
        case TK_CLASS:
            ClassStatement();
            break;
        case TK_ENUM:
            EnumStatement();
            break;
        case _SC('{'):{
                BEGIN_SCOPE();
                Lex();
                Statements();
                Expect(_SC('}'));
                if(closeframe) {
                    END_SCOPE();
                }
                else {
                    END_SCOPE_NO_CLOSE();
                }
            }
            break;
        case TK_TRY:
            TryCatchStatement();
            break;
        case TK_THROW:
            Lex();
            CommaExpr();
            _fs->AddInstruction(_OP_THROW, _fs->PopTarget());
            break;
        case TK_CONST:
            {
            Lex();
            SQObject id = Expect(TK_IDENTIFIER);
            Expect('=');
            SQObject val = ExpectScalar();
            OptionalSemicolon();
            SQTable *enums = _table(_ss(_vm)->_consts);
            SQObjectPtr strongid = id;
            enums->NewSlot(strongid,SQObjectPtr(val));
            strongid.Null();
            }
            break;
        default:
            CommaExpr();
            _fs->DiscardTarget();
            //_fs->PopTarget();
            break;
        }
        _fs->SnoozeOpt();
    }